

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.hpp
# Opt level: O0

string_view cinatra::get_local_time_str<8ul,32ul>(char (*buf) [32],time_t t,string_view format)

{
  tm *ptVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_pointer pvVar4;
  char *in_RDI;
  size_t n;
  char c;
  int i;
  char *p;
  tm *loc_time;
  char c_00;
  char *in_stack_ffffffffffffff88;
  int day;
  char *in_stack_ffffffffffffff90;
  value_type local_61;
  int local_44;
  char *local_40;
  time_t local_30;
  char *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  string_view local_10;
  
  local_28 = in_RDI;
  ptVar1 = gmtime(&local_30);
  local_40 = local_28;
  for (local_44 = 0; sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20),
      (ulong)(long)local_44 < sVar2; local_44 = local_44 + 1) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&local_20,(long)local_44);
    if (*pvVar3 == '%') {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
      if ((ulong)(long)(local_44 + 2) < sVar2) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_20,(long)(local_44 + 2));
        local_61 = *pvVar3;
      }
      else {
        local_61 = '0';
      }
      local_44 = local_44 + 1;
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_20,(long)local_44);
      c_00 = (char)((ulong)in_stack_ffffffffffffff88 >> 0x18);
      day = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      if (*pvVar3 == 'Y') {
        to_year(in_stack_ffffffffffffff90,day,c_00);
        local_40 = local_40 + 5;
      }
      else {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_20,(long)local_44);
        if (*pvVar3 == 'm') {
          to_month(in_stack_ffffffffffffff90,day,c_00);
          local_40 = local_40 + 3;
        }
        else {
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&local_20,(long)local_44);
          if (*pvVar3 == 'd') {
            to_day(in_stack_ffffffffffffff90,day,c_00);
            local_40 = local_40 + 3;
          }
          else {
            pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&local_20,(long)local_44);
            if (*pvVar3 == 'H') {
              to_hour(in_stack_ffffffffffffff90,day,c_00);
              local_40 = local_40 + 3;
            }
            else {
              pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 (&local_20,(long)local_44);
              if (*pvVar3 == 'M') {
                to_min(in_stack_ffffffffffffff90,day,c_00);
                local_40 = local_40 + 3;
              }
              else {
                pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   (&local_20,(long)local_44);
                if (*pvVar3 == 'S') {
                  to_sec(in_stack_ffffffffffffff90,day,c_00);
                  local_40 = local_40 + 3;
                }
                else {
                  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                     (&local_20,(long)local_44);
                  if (*pvVar3 == 'a') {
                    in_stack_ffffffffffffff90 = local_40;
                    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                       ((basic_string_view<char,_std::char_traits<char>_> *)
                                        (WDAY + (long)ptVar1->tm_wday * 0x10));
                    *(undefined2 *)in_stack_ffffffffffffff90 = *(undefined2 *)pvVar4;
                    in_stack_ffffffffffffff90[2] = pvVar4[2];
                    local_40[3] = local_61;
                    local_40[4] = ' ';
                    local_40 = local_40 + 5;
                  }
                  else {
                    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                       (&local_20,(long)local_44);
                    if (*pvVar3 == 'b') {
                      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                         ((basic_string_view<char,_std::char_traits<char>_> *)
                                          (YMON + (long)ptVar1->tm_mon * 0x10));
                      *(undefined2 *)local_40 = *(undefined2 *)pvVar4;
                      local_40[2] = pvVar4[2];
                      local_40[3] = local_61;
                      in_stack_ffffffffffffff88 = local_40;
                      local_40 = local_40 + 4;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_10,local_28,(size_type)(local_40 + ~(ulong)local_28));
  return local_10;
}

Assistant:

inline std::string_view get_local_time_str(char (&buf)[N], std::time_t t,
                                           std::string_view format) {
  static_assert(N >= 20, "wrong buf");
  struct tm *loc_time = gmtime(&t);

  char *p = buf;

  for (int i = 0; i < format.size(); ++i) {
    if (format[i] == '%') {
      char c = i + 2 < format.size() ? format[i + 2] : '0';
      i++;
      if (format[i] == 'Y') {
        to_year(p, loc_time->tm_year + 1900, c);
        p += 5;
      }
      else if (format[i] == 'm') {
        to_month(p, loc_time->tm_mon + 1, c);
        p += 3;
      }
      else if (format[i] == 'd') {
        to_day(p, loc_time->tm_mday, c);
        p += 3;
      }
      else if (format[i] == 'H') {
        to_hour(p, loc_time->tm_hour + Hour, c);
        p += 3;
      }
      else if (format[i] == 'M') {
        to_min(p, loc_time->tm_min, c);
        p += 3;
      }
      else if (format[i] == 'S') {
        to_sec(p, loc_time->tm_sec, c);
        p += 3;
      }
      else if (format[i] == 'a') {
        memcpy(p, WDAY[loc_time->tm_wday].data(), 3);
        p += 3;
        *p++ = c;
        *p++ = ' ';
      }
      else if (format[i] == 'b') {
        memcpy(p, YMON[loc_time->tm_mon].data(), 3);
        p += 3;
        *p = c;
        p += 1;
      }
    }
  }

  size_t n = p - buf - 1;

  return {buf, n};
}